

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS ref_facelift_attach(REF_GRID ref_grid)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_FACELIFT ref_facelift;
  REF_GRID freeable_ref_grid;
  REF_GRID ref_grid_local;
  
  freeable_ref_grid = ref_grid;
  uVar1 = ref_grid_deep_copy((REF_GRID *)&ref_facelift,ref_grid);
  if (uVar1 == 0) {
    uVar1 = ref_facelift_create((REF_FACELIFT *)&ref_private_macro_code_rss_1,(REF_GRID)ref_facelift
                                ,0);
    if (uVar1 == 0) {
      freeable_ref_grid->geom->ref_facelift = _ref_private_macro_code_rss_1;
      uVar1 = ref_facelift_initialize_edge(_ref_private_macro_code_rss_1);
      if (uVar1 == 0) {
        uVar1 = ref_facelift_initialize_face(_ref_private_macro_code_rss_1,freeable_ref_grid->geom);
        if (uVar1 == 0) {
          ref_grid_local._4_4_ = ref_facelift_apply(_ref_private_macro_code_rss_1);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x1bc,"ref_facelift_attach",(ulong)ref_grid_local._4_4_,"apply");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x1bb,"ref_facelift_attach",(ulong)uVar1,"init disp");
          ref_grid_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x1b9,"ref_facelift_attach",(ulong)uVar1,"init disp");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x1b7,"ref_facelift_attach",(ulong)uVar1,"create");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x1b5,"ref_facelift_attach",(ulong)uVar1,"deep copy");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_attach(REF_GRID ref_grid) {
  REF_GRID freeable_ref_grid;
  REF_FACELIFT ref_facelift;
  RSS(ref_grid_deep_copy(&freeable_ref_grid, ref_grid), "deep copy");
  RSS(ref_facelift_create(&ref_facelift, freeable_ref_grid, REF_FALSE),
      "create");
  ref_geom_facelift(ref_grid_geom(ref_grid)) = ref_facelift;
  RSS(ref_facelift_initialize_edge(ref_facelift), "init disp");
  RSS(ref_facelift_initialize_face(ref_facelift, ref_grid_geom(ref_grid)),
      "init disp");
  RSS(ref_facelift_apply(ref_facelift), "apply");
  return REF_SUCCESS;
}